

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O2

void absl::lts_20240722::cord_internal::CordRepFlat::Delete(CordRep *rep)

{
  byte tag;
  size_t sVar1;
  
  tag = rep->tag;
  if ((6 < tag - 0xf9) && (5 < tag)) {
    sVar1 = TagToAllocatedSize(tag);
    operator_delete(rep,sVar1);
    return;
  }
  __assert_fail("rep->tag >= FLAT && rep->tag <= MAX_FLAT_TAG",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                ,0x92,"static void absl::cord_internal::CordRepFlat::Delete(CordRep *)");
}

Assistant:

static void Delete(CordRep*rep) {
    assert(rep->tag >= FLAT && rep->tag <= MAX_FLAT_TAG);

#if defined(__cpp_sized_deallocation)
    size_t size = TagToAllocatedSize(rep->tag);
    rep->~CordRep();
    ::operator delete(rep, size);
#else
    rep->~CordRep();
    ::operator delete(rep);
#endif
  }